

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O1

void __thiscall
flatbuffers::FlatBufferBuilder::TrackField(FlatBufferBuilder *this,voffset_t field,uoffset_t off)

{
  pointer *ppFVar1;
  iterator __position;
  undefined8 in_RAX;
  FieldLoc fl;
  FieldLoc local_8;
  
  local_8._6_2_ = SUB82((ulong)in_RAX >> 0x30,0);
  local_8.id = field;
  local_8.off = off;
  __position._M_current =
       (this->offsetbuf_).
       super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->offsetbuf_).
      super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<flatbuffers::FlatBufferBuilder::FieldLoc,std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>>
    ::_M_realloc_insert<flatbuffers::FlatBufferBuilder::FieldLoc_const&>
              ((vector<flatbuffers::FlatBufferBuilder::FieldLoc,std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>>
                *)&this->offsetbuf_,__position,&local_8);
  }
  else {
    *__position._M_current = local_8;
    ppFVar1 = &(this->offsetbuf_).
               super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppFVar1 = *ppFVar1 + 1;
  }
  return;
}

Assistant:

void TrackField(voffset_t field, uoffset_t off) {
    FieldLoc fl = { off, field };
    offsetbuf_.push_back(fl);
  }